

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderStorageBufferObjectTests.cpp
# Opt level: O0

char * glcts::anon_unknown_0::GetInputOp1
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data,
                 vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data)

{
  reference pvVar1;
  reference pvVar2;
  float *fp_1;
  int *ip_1;
  float *fp;
  int *ip;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *out_data_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_data_local;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(in_data,0x90);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](in_data,0);
  pvVar1[0] = '\x01';
  pvVar1[1] = '\0';
  pvVar1[2] = '\0';
  pvVar1[3] = '\0';
  pvVar1[4] = '\x02';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  pvVar1[8] = '\x03';
  pvVar1[9] = '\0';
  pvVar1[10] = '\0';
  pvVar1[0xb] = '\0';
  pvVar1[0xc] = '\x04';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = '\0';
  pvVar1[0xf] = '\0';
  pvVar2[0x10] = '\0';
  pvVar2[0x11] = '\0';
  pvVar2[0x12] = 0x80;
  pvVar2[0x13] = '?';
  pvVar2[0x14] = '\0';
  pvVar2[0x15] = '\0';
  pvVar2[0x16] = '\0';
  pvVar2[0x17] = '@';
  pvVar2[0x18] = '\0';
  pvVar2[0x19] = '\0';
  pvVar2[0x1a] = '@';
  pvVar2[0x1b] = '@';
  pvVar2[0x1c] = '\0';
  pvVar2[0x1d] = '\0';
  pvVar2[0x1e] = '\0';
  pvVar2[0x1f] = '\0';
  pvVar1[0x20] = '\x01';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '\0';
  pvVar1[0x23] = '\0';
  pvVar1[0x24] = '\x02';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = '\0';
  pvVar1[0x27] = '\0';
  pvVar1[0x28] = '\x03';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = '\0';
  pvVar1[0x2b] = '\0';
  pvVar1[0x2c] = '\x04';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '\0';
  pvVar1[0x2f] = '\0';
  pvVar1[0x30] = '\x01';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = '\0';
  pvVar1[0x33] = '\0';
  pvVar1[0x34] = 0xfe;
  pvVar1[0x35] = 0xff;
  pvVar1[0x36] = 0xff;
  pvVar1[0x37] = 0xff;
  pvVar1[0x38] = '\x03';
  pvVar1[0x39] = '\0';
  pvVar1[0x3a] = '\0';
  pvVar1[0x3b] = '\0';
  pvVar1[0x3c] = '\x04';
  pvVar1[0x3d] = '\0';
  pvVar1[0x3e] = '\0';
  pvVar1[0x3f] = '\0';
  pvVar2[0x40] = '\0';
  pvVar2[0x41] = '\0';
  pvVar2[0x42] = 0x80;
  pvVar2[0x43] = '?';
  pvVar2[0x44] = '\0';
  pvVar2[0x45] = '\0';
  pvVar2[0x46] = '\0';
  pvVar2[0x47] = '@';
  pvVar2[0x48] = '\0';
  pvVar2[0x49] = '\0';
  pvVar2[0x4a] = '@';
  pvVar2[0x4b] = '@';
  pvVar2[0x4c] = '\0';
  pvVar2[0x4d] = '\0';
  pvVar2[0x4e] = 0x80;
  pvVar2[0x4f] = '@';
  pvVar2[0x50] = '\0';
  pvVar2[0x51] = '\0';
  pvVar2[0x52] = 0x80;
  pvVar2[0x53] = '?';
  pvVar2[0x54] = '\0';
  pvVar2[0x55] = '\0';
  pvVar2[0x56] = '\0';
  pvVar2[0x57] = '@';
  pvVar2[0x58] = '\0';
  pvVar2[0x59] = '\0';
  pvVar2[0x5a] = '@';
  pvVar2[0x5b] = '@';
  pvVar2[0x5c] = '\0';
  pvVar2[0x5d] = '\0';
  pvVar2[0x5e] = 0x80;
  pvVar2[0x5f] = '@';
  pvVar2[0x60] = '\0';
  pvVar2[0x61] = '\0';
  pvVar2[0x62] = 0x80;
  pvVar2[99] = '?';
  pvVar2[100] = '\0';
  pvVar2[0x65] = '\0';
  pvVar2[0x66] = '\0';
  pvVar2[0x67] = '@';
  pvVar2[0x68] = '\0';
  pvVar2[0x69] = '\0';
  pvVar2[0x6a] = '@';
  pvVar2[0x6b] = '@';
  pvVar2[0x6c] = '\0';
  pvVar2[0x6d] = '\0';
  pvVar2[0x6e] = 0x80;
  pvVar2[0x6f] = '@';
  pvVar2[0x70] = '\0';
  pvVar2[0x71] = '\0';
  pvVar2[0x72] = 0x80;
  pvVar2[0x73] = '?';
  pvVar2[0x74] = '\0';
  pvVar2[0x75] = '\0';
  pvVar2[0x76] = '\0';
  pvVar2[0x77] = '@';
  pvVar2[0x78] = '\0';
  pvVar2[0x79] = '\0';
  pvVar2[0x7a] = '@';
  pvVar2[0x7b] = '@';
  pvVar2[0x7c] = '\0';
  pvVar2[0x7d] = '\0';
  pvVar2[0x7e] = 0x80;
  pvVar2[0x7f] = '@';
  pvVar2[0x80] = '\0';
  pvVar2[0x81] = '\0';
  pvVar2[0x82] = 0x80;
  pvVar2[0x83] = '?';
  pvVar2[0x84] = '\0';
  pvVar2[0x85] = '\0';
  pvVar2[0x86] = '\0';
  pvVar2[0x87] = '\0';
  pvVar2[0x88] = '\0';
  pvVar2[0x89] = '\0';
  pvVar2[0x8a] = '\0';
  pvVar2[0x8b] = '\0';
  pvVar2[0x8c] = '\0';
  pvVar2[0x8d] = '\0';
  pvVar2[0x8e] = 0x80;
  pvVar2[0x8f] = '@';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(out_data,0x90);
  pvVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](out_data,0);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](out_data,0);
  pvVar1[0] = '\x04';
  pvVar1[1] = '\0';
  pvVar1[2] = '\0';
  pvVar1[3] = '\0';
  pvVar1[4] = '\x03';
  pvVar1[5] = '\0';
  pvVar1[6] = '\0';
  pvVar1[7] = '\0';
  pvVar1[8] = '\x02';
  pvVar1[9] = '\0';
  pvVar1[10] = '\0';
  pvVar1[0xb] = '\0';
  pvVar1[0xc] = '\x01';
  pvVar1[0xd] = '\0';
  pvVar1[0xe] = '\0';
  pvVar1[0xf] = '\0';
  pvVar2[0x10] = '\0';
  pvVar2[0x11] = '\0';
  pvVar2[0x12] = '@';
  pvVar2[0x13] = '@';
  pvVar2[0x14] = '\0';
  pvVar2[0x15] = '\0';
  pvVar2[0x16] = '\0';
  pvVar2[0x17] = '@';
  pvVar2[0x18] = '\0';
  pvVar2[0x19] = '\0';
  pvVar2[0x1a] = 0x80;
  pvVar2[0x1b] = '?';
  pvVar2[0x1c] = '\0';
  pvVar2[0x1d] = '\0';
  pvVar2[0x1e] = '\0';
  pvVar2[0x1f] = '\0';
  pvVar1[0x20] = '\x04';
  pvVar1[0x21] = '\0';
  pvVar1[0x22] = '\0';
  pvVar1[0x23] = '\0';
  pvVar1[0x24] = '\x01';
  pvVar1[0x25] = '\0';
  pvVar1[0x26] = '\0';
  pvVar1[0x27] = '\0';
  pvVar1[0x28] = '\0';
  pvVar1[0x29] = '\0';
  pvVar1[0x2a] = '\0';
  pvVar1[0x2b] = '\0';
  pvVar1[0x2c] = '\x03';
  pvVar1[0x2d] = '\0';
  pvVar1[0x2e] = '\0';
  pvVar1[0x2f] = '\0';
  pvVar1[0x30] = '\n';
  pvVar1[0x31] = '\0';
  pvVar1[0x32] = '\0';
  pvVar1[0x33] = '\0';
  pvVar1[0x34] = '\x04';
  pvVar1[0x35] = '\0';
  pvVar1[0x36] = '\0';
  pvVar1[0x37] = '\0';
  pvVar1[0x38] = 0xfe;
  pvVar1[0x39] = 0xff;
  pvVar1[0x3a] = 0xff;
  pvVar1[0x3b] = 0xff;
  pvVar1[0x3c] = '\x14';
  pvVar1[0x3d] = '\0';
  pvVar1[0x3e] = '\0';
  pvVar1[0x3f] = '\0';
  pvVar2[0x40] = '\0';
  pvVar2[0x41] = '\0';
  pvVar2[0x42] = 'H';
  pvVar2[0x43] = 'B';
  pvVar2[0x44] = '\0';
  pvVar2[0x45] = '\0';
  pvVar2[0x46] = 0xa0;
  pvVar2[0x47] = '@';
  pvVar2[0x48] = '\0';
  pvVar2[0x49] = '\0';
  pvVar2[0x4a] = '\0';
  pvVar2[0x4b] = '@';
  pvVar2[0x4c] = '\0';
  pvVar2[0x4d] = '\0';
  pvVar2[0x4e] = 0xf0;
  pvVar2[0x4f] = 'A';
  pvVar2[0x50] = '\0';
  pvVar2[0x51] = '\0';
  pvVar2[0x52] = 0x80;
  pvVar2[0x53] = '@';
  pvVar2[0x54] = '\0';
  pvVar2[0x55] = '\0';
  pvVar2[0x56] = '\0';
  pvVar2[0x57] = '@';
  pvVar2[0x58] = '\0';
  pvVar2[0x59] = '\0';
  pvVar2[0x5a] = '@';
  pvVar2[0x5b] = '@';
  pvVar2[0x5c] = '\0';
  pvVar2[0x5d] = '\0';
  pvVar2[0x5e] = 0x80;
  pvVar2[0x5f] = '?';
  pvVar2[0x60] = '\0';
  pvVar2[0x61] = '\0';
  pvVar2[0x62] = 0x80;
  pvVar2[99] = '@';
  pvVar2[100] = '\0';
  pvVar2[0x65] = '\0';
  pvVar2[0x66] = '@';
  pvVar2[0x67] = '@';
  pvVar2[0x68] = '\0';
  pvVar2[0x69] = '\0';
  pvVar2[0x6a] = '\0';
  pvVar2[0x6b] = '@';
  pvVar2[0x6c] = '\0';
  pvVar2[0x6d] = '\0';
  pvVar2[0x6e] = 0x80;
  pvVar2[0x6f] = '?';
  pvVar2[0x70] = '\0';
  pvVar2[0x71] = '\0';
  pvVar2[0x72] = '\0';
  pvVar2[0x73] = '@';
  pvVar2[0x74] = '\0';
  pvVar2[0x75] = '\0';
  pvVar2[0x76] = '\0';
  pvVar2[0x77] = '@';
  pvVar2[0x78] = '\0';
  pvVar2[0x79] = '\0';
  pvVar2[0x7a] = '\0';
  pvVar2[0x7b] = '@';
  pvVar2[0x7c] = '\0';
  pvVar2[0x7d] = '\0';
  pvVar2[0x7e] = '\0';
  pvVar2[0x7f] = '@';
  pvVar2[0x80] = '\0';
  pvVar2[0x81] = '\0';
  pvVar2[0x82] = 0x80;
  pvVar2[0x83] = '@';
  pvVar2[0x84] = '\0';
  pvVar2[0x85] = '\0';
  pvVar2[0x86] = '\0';
  pvVar2[0x87] = '\0';
  pvVar2[0x88] = '\0';
  pvVar2[0x89] = '\0';
  pvVar2[0x8a] = '\0';
  pvVar2[0x8b] = '\0';
  pvVar2[0x8c] = '\0';
  pvVar2[0x8d] = '\0';
  pvVar2[0x8e] = 0x80;
  pvVar2[0x8f] = '?';
  return 
  "\nlayout(std430, binding = 0) buffer Input {\n  ivec4 data0;\n  vec3 data1;\n  uvec4 data2;\n  ivec4 data3;\n  vec4 data4;\n  mat4 data5;\n} g_input;\nlayout(std430, binding = 1) buffer Output {\n  ivec4 data0;\n  vec3 data1;\n  uvec4 data2;\n  ivec4 data3;\n  vec4 data4;\n  mat4 data5;\n} g_output;\nuniform vec3 g_value0;\nuniform int g_index1;\nvoid main() {\n  int index0 = 0;\n  g_output.data0.wzyx = g_input.data0;\n  g_output.data1 = g_input.data1.zyx;\n  g_output.data2.xwy = g_input.data2.wzx;\n  g_output.data3.xw = ivec2(10, 20);\n  g_output.data3.zy = g_input.data3.yw;\n  g_output.data4.wx = g_value0.xz;\n  g_output.data4.wx += g_value0.yy;\n  g_output.data4.yz = g_input.data4.xx + g_input.data4.wx;\n  g_output.data5[g_index1 - 1].wyzx = vec4(1, 2, 3, 4);\n  g_output.data5[g_index1 + index0] = g_input.data5[g_index1].wzyx;\n  g_output.data5[1 + g_index1] = g_input.data5[g_index1 + 1].yyyy;\n  g_output.data5[5 - g_index1 - 1].wx = g_input.data5[4 - g_index1].xw;\n}"
  ;
}

Assistant:

const char* GetInputOp1(std::vector<GLubyte>& in_data, std::vector<GLubyte>& out_data)
{
	/* input */
	{
		in_data.resize(16 * 9);
		int*   ip = reinterpret_cast<int*>(&in_data[0]);
		float* fp = reinterpret_cast<float*>(&in_data[0]);
		ip[0]	 = 1;
		ip[1]	 = 2;
		ip[2]	 = 3;
		ip[3]	 = 4; // data0
		fp[4]	 = 1.0f;
		fp[5]	 = 2.0f;
		fp[6]	 = 3.0f;
		fp[7]	 = 0.0f; // data1
		ip[8]	 = 1;
		ip[9]	 = 2;
		ip[10]	= 3;
		ip[11]	= 4; // data2
		ip[12]	= 1;
		ip[13]	= -2;
		ip[14]	= 3;
		ip[15]	= 4; // data3
		fp[16]	= 1.0f;
		fp[17]	= 2.0f;
		fp[18]	= 3.0f;
		fp[19]	= 4.0f; // data4
		fp[20]	= 1.0f;
		fp[21]	= 2.0f;
		fp[22]	= 3.0f;
		fp[23]	= 4.0f; // data5
		fp[24]	= 1.0f;
		fp[25]	= 2.0f;
		fp[26]	= 3.0f;
		fp[27]	= 4.0f; // data5
		fp[28]	= 1.0f;
		fp[29]	= 2.0f;
		fp[30]	= 3.0f;
		fp[31]	= 4.0f; // data5
		fp[32]	= 1.0f;
		fp[33]	= 0.0f;
		fp[34]	= 0.0f;
		fp[35]	= 4.0f; // data5
	}
	/* expected output */
	{
		out_data.resize(16 * 9);
		int*   ip = reinterpret_cast<int*>(&out_data[0]);
		float* fp = reinterpret_cast<float*>(&out_data[0]);
		ip[0]	 = 4;
		ip[1]	 = 3;
		ip[2]	 = 2;
		ip[3]	 = 1;
		fp[4]	 = 3.0f;
		fp[5]	 = 2.0f;
		fp[6]	 = 1.0f;
		fp[7]	 = 0.0f;
		ip[8]	 = 4;
		ip[9]	 = 1;
		ip[10]	= 0;
		ip[11]	= 3;
		ip[12]	= 10;
		ip[13]	= 4;
		ip[14]	= -2;
		ip[15]	= 20;
		fp[16]	= 50.0f;
		fp[17]	= 5.0f;
		fp[18]	= 2.0f;
		fp[19]	= 30.0f;
		fp[20]	= 4.0f;
		fp[21]	= 2.0f;
		fp[22]	= 3.0f;
		fp[23]	= 1.0f; // data5
		fp[24]	= 4.0f;
		fp[25]	= 3.0f;
		fp[26]	= 2.0f;
		fp[27]	= 1.0f; // data5
		fp[28]	= 2.0f;
		fp[29]	= 2.0f;
		fp[30]	= 2.0f;
		fp[31]	= 2.0f; // data5
		fp[32]	= 4.0f;
		fp[33]	= 0.0f;
		fp[34]	= 0.0f;
		fp[35]	= 1.0f; // data5
	}
	return NL "layout(std430, binding = 0) buffer Input {" NL "  ivec4 data0;" NL "  vec3 data1;" NL "  uvec4 data2;" NL
			  "  ivec4 data3;" NL "  vec4 data4;" NL "  mat4 data5;" NL "} g_input;" NL
			  "layout(std430, binding = 1) buffer Output {" NL "  ivec4 data0;" NL "  vec3 data1;" NL
			  "  uvec4 data2;" NL "  ivec4 data3;" NL "  vec4 data4;" NL "  mat4 data5;" NL "} g_output;" NL
			  "uniform vec3 g_value0;" NL "uniform int g_index1;" NL "void main() {" NL "  int index0 = 0;" NL
			  "  g_output.data0.wzyx = g_input.data0;" NL "  g_output.data1 = g_input.data1.zyx;" NL
			  "  g_output.data2.xwy = g_input.data2.wzx;" NL "  g_output.data3.xw = ivec2(10, 20);" NL
			  "  g_output.data3.zy = g_input.data3.yw;" NL "  g_output.data4.wx = g_value0.xz;" // w == 10.0, x == 30.0
		NL "  g_output.data4.wx += g_value0.yy;"												// w == 30.0, x == 50.0
		NL "  g_output.data4.yz = g_input.data4.xx + g_input.data4.wx;"							// y == 5.0, z == 2.0
		NL "  g_output.data5[g_index1 - 1].wyzx = vec4(1, 2, 3, 4);" NL
			  "  g_output.data5[g_index1 + index0] = g_input.data5[g_index1].wzyx;" NL
			  "  g_output.data5[1 + g_index1] = g_input.data5[g_index1 + 1].yyyy;" NL
			  "  g_output.data5[5 - g_index1 - 1].wx = g_input.data5[4 - g_index1].xw;" NL "}";
}